

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx *cctx,ZSTD_cParameter param,uint value)

{
  int iVar1;
  size_t sVar2;
  int in_EDX;
  ZSTD_cParameter in_ESI;
  long in_RDI;
  uint in_stack_ffffffffffffffe0;
  size_t local_8;
  
  if (*(int *)(in_RDI + 0x360) != 0) {
    iVar1 = ZSTD_isUpdateAuthorized(in_ESI);
    if (iVar1 == 0) {
      return 0xffffffffffffffc4;
    }
    *(undefined4 *)(in_RDI + 4) = 1;
  }
  if (in_ESI == ZSTD_p_format) {
    local_8 = ZSTD_CCtxParam_setParameter
                        ((ZSTD_CCtx_params *)CONCAT44(10,in_EDX),ZSTD_p_format,
                         in_stack_ffffffffffffffe0);
  }
  else if (in_ESI == ZSTD_p_compressionLevel) {
    if (*(long *)(in_RDI + 0x370) == 0) {
      local_8 = ZSTD_CCtxParam_setParameter
                          ((ZSTD_CCtx_params *)CONCAT44(100,in_EDX),ZSTD_p_compressionLevel,
                           in_stack_ffffffffffffffe0);
    }
    else {
      local_8 = 0xffffffffffffffc4;
    }
  }
  else if (in_ESI - ZSTD_p_windowLog < 7) {
    if (*(long *)(in_RDI + 0x370) == 0) {
      local_8 = ZSTD_CCtxParam_setParameter
                          ((ZSTD_CCtx_params *)CONCAT44(in_ESI,in_EDX),in_ESI,
                           in_stack_ffffffffffffffe0);
    }
    else {
      local_8 = 0xffffffffffffffc4;
    }
  }
  else if (in_ESI - ZSTD_p_enableLongDistanceMatching < 5) {
    if (*(long *)(in_RDI + 0x370) == 0) {
      local_8 = ZSTD_CCtxParam_setParameter
                          ((ZSTD_CCtx_params *)CONCAT44(in_ESI,in_EDX),in_ESI,
                           in_stack_ffffffffffffffe0);
    }
    else {
      local_8 = 0xffffffffffffffc4;
    }
  }
  else {
    if (2 < in_ESI - ZSTD_p_contentSizeFlag) {
      if (in_ESI == ZSTD_p_nbWorkers) {
        if ((in_EDX != 0) && (*(long *)(in_RDI + 0x1a8) != 0)) {
          return 0xffffffffffffffd8;
        }
        sVar2 = ZSTD_CCtxParam_setParameter
                          ((ZSTD_CCtx_params *)CONCAT44(400,in_EDX),ZSTD_p_nbWorkers,
                           in_stack_ffffffffffffffe0);
        return sVar2;
      }
      if (in_ESI - ZSTD_p_jobSize < 2) {
        sVar2 = ZSTD_CCtxParam_setParameter
                          ((ZSTD_CCtx_params *)CONCAT44(in_ESI,in_EDX),in_ESI,
                           in_stack_ffffffffffffffe0);
        return sVar2;
      }
      if (in_ESI != ZSTD_p_compressLiterals) {
        if (in_ESI != ZSTD_p_forceMaxWindow) {
          return 0xffffffffffffffd8;
        }
        sVar2 = ZSTD_CCtxParam_setParameter
                          ((ZSTD_CCtx_params *)CONCAT44(0x44c,in_EDX),ZSTD_p_forceMaxWindow,
                           in_stack_ffffffffffffffe0);
        return sVar2;
      }
    }
    local_8 = ZSTD_CCtxParam_setParameter
                        ((ZSTD_CCtx_params *)CONCAT44(in_ESI,in_EDX),in_ESI,
                         in_stack_ffffffffffffffe0);
  }
  return local_8;
}

Assistant:

size_t ZSTD_CCtx_setParameter(ZSTD_CCtx* cctx, ZSTD_cParameter param, unsigned value)
{
    DEBUGLOG(4, "ZSTD_CCtx_setParameter (%u, %u)", (U32)param, value);
    if (cctx->streamStage != zcss_init) {
        if (ZSTD_isUpdateAuthorized(param)) {
            cctx->cParamsChanged = 1;
        } else {
            return ERROR(stage_wrong);
    }   }

    switch(param)
    {
    case ZSTD_p_format :
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_compressionLevel:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_windowLog:
    case ZSTD_p_hashLog:
    case ZSTD_p_chainLog:
    case ZSTD_p_searchLog:
    case ZSTD_p_minMatch:
    case ZSTD_p_targetLength:
    case ZSTD_p_compressionStrategy:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_compressLiterals:
    case ZSTD_p_contentSizeFlag:
    case ZSTD_p_checksumFlag:
    case ZSTD_p_dictIDFlag:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_forceMaxWindow :  /* Force back-references to remain < windowSize,
                                   * even when referencing into Dictionary content.
                                   * default : 0 when using a CDict, 1 when using a Prefix */
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_nbWorkers:
        if ((value>0) && cctx->staticSize) {
            return ERROR(parameter_unsupported);  /* MT not compatible with static alloc */
        }
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_jobSize:
    case ZSTD_p_overlapSizeLog:
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    case ZSTD_p_enableLongDistanceMatching:
    case ZSTD_p_ldmHashLog:
    case ZSTD_p_ldmMinMatch:
    case ZSTD_p_ldmBucketSizeLog:
    case ZSTD_p_ldmHashEveryLog:
        if (cctx->cdict) return ERROR(stage_wrong);
        return ZSTD_CCtxParam_setParameter(&cctx->requestedParams, param, value);

    default: return ERROR(parameter_unsupported);
    }
}